

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subflow.cc
# Opt level: O0

bool __thiscall SubfloatFlow::traceForward(SubfloatFlow *this,ReplaceVarnode *rvn)

{
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  reference ppPVar4;
  Varnode *vn;
  _List_const_iterator<PcodeOp_*> local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _List_const_iterator<PcodeOp_*> local_60;
  const_iterator enditer;
  const_iterator iter;
  int4 hcount;
  int4 dcount;
  bool inworklist;
  Varnode *pVStack_40;
  int4 slot;
  Varnode *outvn;
  PcodeOp *op;
  ReplaceOp *rop;
  ReplaceVarnode *rvn2;
  ReplaceVarnode *rvn_local;
  SubfloatFlow *this_local;
  
  iter._M_node._4_4_ = 0;
  iter._M_node._0_4_ = 0;
  rvn2 = rvn;
  rvn_local = (ReplaceVarnode *)this;
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&enditer);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_60);
  local_68 = (_List_node_base *)Varnode::beginDescend(rvn2->vn);
  enditer._M_node = local_68;
  local_70 = (_List_node_base *)Varnode::endDescend(rvn2->vn);
  local_60._M_node = local_70;
  do {
    do {
      bVar1 = std::operator!=(&enditer,&local_60);
      if (!bVar1) {
        if ((iter._M_node._4_4_ == (int)iter._M_node) ||
           (bVar1 = Varnode::isInput(rvn2->vn), !bVar1)) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
        return this_local._7_1_;
      }
      local_78._M_node =
           (_List_node_base *)std::_List_const_iterator<PcodeOp_*>::operator++(&enditer,0);
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_78);
      outvn = (Varnode *)*ppPVar4;
      pVStack_40 = PcodeOp::getOut((PcodeOp *)outvn);
    } while ((pVStack_40 != (Varnode *)0x0) && (bVar1 = Varnode::isMark(pVStack_40), bVar1));
    iter._M_node._4_4_ = iter._M_node._4_4_ + 1;
    dcount = PcodeOp::getSlot((PcodeOp *)outvn,rvn2->vn);
    OVar2 = PcodeOp::code((PcodeOp *)outvn);
    switch(OVar2) {
    case CPUI_COPY:
    case CPUI_FLOAT_ADD:
    case CPUI_FLOAT_DIV:
    case CPUI_FLOAT_MULT:
    case CPUI_FLOAT_SUB:
    case CPUI_FLOAT_NEG:
    case CPUI_FLOAT_ABS:
    case CPUI_FLOAT_SQRT:
    case CPUI_FLOAT_CEIL:
    case CPUI_FLOAT_FLOOR:
    case CPUI_FLOAT_ROUND:
    case CPUI_MULTIEQUAL:
      OVar2 = PcodeOp::code((PcodeOp *)outvn);
      iVar3 = PcodeOp::numInput((PcodeOp *)outvn);
      op = (PcodeOp *)createOpDown(this,OVar2,iVar3,(PcodeOp *)outvn,rvn2,dcount);
      bVar1 = createLink(this,(ReplaceOp *)op,-1,pVStack_40);
      if (!bVar1) {
        return false;
      }
      break;
    default:
      return false;
    case CPUI_FLOAT_EQUAL:
    case CPUI_FLOAT_NOTEQUAL:
    case CPUI_FLOAT_LESS:
    case CPUI_FLOAT_LESSEQUAL:
      vn = PcodeOp::getIn((PcodeOp *)outvn,1 - dcount);
      rop = (ReplaceOp *)setReplacement(this,vn,(bool *)((long)&hcount + 3));
      if (rop == (ReplaceOp *)0x0) {
        return false;
      }
      if ((hcount._3_1_ & 1) != 0) {
        std::vector<SubfloatFlow::ReplaceVarnode_*,_std::allocator<SubfloatFlow::ReplaceVarnode_*>_>
        ::push_back(&this->worklist,(value_type *)&rop);
      }
      if (dcount == 0) {
        addtocomplist(this,rvn2,(ReplaceVarnode *)rop,(PcodeOp *)outvn);
      }
      else {
        addtocomplist(this,(ReplaceVarnode *)rop,rvn2,(PcodeOp *)outvn);
      }
      break;
    case CPUI_FLOAT_NAN:
    case CPUI_FLOAT_TRUNC:
      addtopulllist(this,(PcodeOp *)outvn,rvn2);
      break;
    case CPUI_FLOAT_FLOAT2FLOAT:
      iVar3 = Varnode::getSize(pVStack_40);
      if (iVar3 < this->precision) {
        return false;
      }
      addtopulllist(this,(PcodeOp *)outvn,rvn2);
    }
    iter._M_node._0_4_ = (int)iter._M_node + 1;
  } while( true );
}

Assistant:

bool SubfloatFlow::traceForward(ReplaceVarnode *rvn)

{ // Try to trace logical variable through descendant varnodes
  // updating list/map of replace_ops and replace_varnodes
  // and the worklist
  ReplaceVarnode *rvn2;
  ReplaceOp *rop;
  PcodeOp *op;
  Varnode *outvn;
  int4 slot;
  bool inworklist;
  int4 dcount = 0;
  int4 hcount = 0;

  list<PcodeOp *>::const_iterator iter,enditer;
  iter = rvn->vn->beginDescend();
  enditer = rvn->vn->endDescend();
  while(iter != enditer) {
    op = *iter++;
    outvn = op->getOut();
    if ((outvn!=(Varnode *)0)&&(outvn->isMark()))
      continue;
    dcount += 1;		// Count this descendant
    slot = op->getSlot(rvn->vn);
    switch(op->code()) {
    case CPUI_COPY:
    case CPUI_FLOAT_CEIL:
    case CPUI_FLOAT_FLOOR:
    case CPUI_FLOAT_ROUND:
    case CPUI_FLOAT_NEG:
    case CPUI_FLOAT_ABS:
    case CPUI_FLOAT_SQRT:
    case CPUI_FLOAT_ADD:
    case CPUI_FLOAT_SUB:
    case CPUI_FLOAT_MULT:
    case CPUI_FLOAT_DIV:
    case CPUI_MULTIEQUAL:
      rop = createOpDown(op->code(),op->numInput(),op,rvn,slot);
      if (!createLink(rop,-1,outvn)) return false;
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_FLOAT2FLOAT:
      if (outvn->getSize() < precision)
	return false;
      addtopulllist(op,rvn);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_EQUAL:
    case CPUI_FLOAT_NOTEQUAL:
    case CPUI_FLOAT_LESS:
    case CPUI_FLOAT_LESSEQUAL:
      rvn2 = setReplacement(op->getIn(1-slot),inworklist);
      if (rvn2 == (ReplaceVarnode *)0) return false;
      if (inworklist)
	worklist.push_back(rvn2);
      if (slot == 0)
	addtocomplist(rvn,rvn2,op);
      else
	addtocomplist(rvn2,rvn,op);
      hcount += 1;		// Dealt with this descendant
      break;
    case CPUI_FLOAT_TRUNC:
    case CPUI_FLOAT_NAN:
      addtopulllist(op,rvn);
      hcount += 1;
      break;
    default:
      return false;
    }
  }
  if (dcount != hcount) {
    // Must account for all descendants of an input
    if (rvn->vn->isInput()) return false;
  }
  return true;
}